

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strchr.c
# Opt level: O1

int main(void)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char abccd [6];
  char local_10 [8];
  
  pcVar2 = local_10;
  builtin_strncpy(local_10,"abccd",6);
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '\0') goto LAB_001021c9;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != 'x');
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
         ,0x21,"strchr( abccd, \'x\' ) == NULL");
LAB_001021c9:
  if (local_10[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x22,"strchr( abccd, \'a\' ) == &abccd[0]");
  }
  pcVar2 = local_10;
  do {
    cVar1 = *pcVar2;
    if (cVar1 == 'd') goto LAB_00102205;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != '\0');
  pcVar2 = (char *)0x0;
LAB_00102205:
  if (pcVar2 != local_10 + 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x23,"strchr( abccd, \'d\' ) == &abccd[4]");
  }
  pcVar2 = local_10;
  sVar3 = strlen(pcVar2);
  if (sVar3 != 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x24,"strchr( abccd, \'\\0\' ) == &abccd[5]");
  }
  do {
    cVar1 = *pcVar2;
    if (cVar1 == 'c') goto LAB_00102271;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != '\0');
  pcVar2 = (char *)0x0;
LAB_00102271:
  if (pcVar2 != local_10 + 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x25,"strchr( abccd, \'c\' ) == &abccd[2]");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char abccd[] = "abccd";
    TESTCASE( strchr( abccd, 'x' ) == NULL );
    TESTCASE( strchr( abccd, 'a' ) == &abccd[0] );
    TESTCASE( strchr( abccd, 'd' ) == &abccd[4] );
    TESTCASE( strchr( abccd, '\0' ) == &abccd[5] );
    TESTCASE( strchr( abccd, 'c' ) == &abccd[2] );
    return TEST_RESULTS;
}